

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O2

void SVGChart::MakeExamplePlot6(PPlot *ioPPlot)

{
  double dVar1;
  PlotDataBase *pPVar2;
  PlotDataBase *pPVar3;
  LineDataDrawer *pLVar4;
  int iVar5;
  float local_4c;
  double local_48;
  PPlot *local_40;
  PlotDataContainer *local_38;
  
  local_40 = ioPPlot;
  std::__cxx11::string::assign((char *)&(ioPPlot->mPlotBackground).mTitle);
  pPVar2 = (PlotDataBase *)operator_new(0x20);
  pPVar2->_vptr_PlotDataBase = (_func_int **)0x0;
  pPVar2[1]._vptr_PlotDataBase = (_func_int **)0x0;
  pPVar2[2]._vptr_PlotDataBase = (_func_int **)0x0;
  pPVar2[3]._vptr_PlotDataBase = (_func_int **)0x0;
  pPVar2->_vptr_PlotDataBase = (_func_int **)&PTR__PlotData_00111c00;
  pPVar3 = (PlotDataBase *)operator_new(0x20);
  pPVar3->_vptr_PlotDataBase = (_func_int **)0x0;
  pPVar3[1]._vptr_PlotDataBase = (_func_int **)0x0;
  pPVar3[2]._vptr_PlotDataBase = (_func_int **)0x0;
  pPVar3[3]._vptr_PlotDataBase = (_func_int **)0x0;
  pPVar3->_vptr_PlotDataBase = (_func_int **)&PTR__PlotData_00111c00;
  dVar1 = 0.0;
  for (iVar5 = 0; iVar5 != 0xb; iVar5 = iVar5 + 1) {
    local_4c = (float)(dVar1 * 0.001 + 0.0001);
    local_48 = dVar1;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>
              ((vector<float,_std::allocator<float>_> *)(pPVar2 + 1),&local_4c);
    local_4c = (float)iVar5 * 0.0001 * (float)iVar5 + 0.01;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>
              ((vector<float,_std::allocator<float>_> *)(pPVar3 + 1),&local_4c);
    dVar1 = local_48 + 1.0;
  }
  pLVar4 = (LineDataDrawer *)operator_new(0xa8);
  LineDataDrawer::LineDataDrawer(pLVar4);
  (pLVar4->super_DataDrawerBase).field_0x25 = 1;
  (pLVar4->mStyle).mPenWidth = 3;
  local_38 = &local_40->mPlotDataContainer;
  PlotDataContainer::AddXYPlot
            (local_38,pPVar2,pPVar3,(LegendData *)0x0,(DataDrawerBase *)pLVar4,
             (PlotDataSelection *)0x0);
  pPVar2 = (PlotDataBase *)operator_new(0x20);
  pPVar2->_vptr_PlotDataBase = (_func_int **)0x0;
  pPVar2[1]._vptr_PlotDataBase = (_func_int **)0x0;
  pPVar2[2]._vptr_PlotDataBase = (_func_int **)0x0;
  pPVar2[3]._vptr_PlotDataBase = (_func_int **)0x0;
  pPVar2->_vptr_PlotDataBase = (_func_int **)&PTR__PlotData_00111c00;
  pPVar3 = (PlotDataBase *)operator_new(0x20);
  pPVar3->_vptr_PlotDataBase = (_func_int **)0x0;
  pPVar3[1]._vptr_PlotDataBase = (_func_int **)0x0;
  pPVar3[2]._vptr_PlotDataBase = (_func_int **)0x0;
  pPVar3[3]._vptr_PlotDataBase = (_func_int **)0x0;
  pPVar3->_vptr_PlotDataBase = (_func_int **)&PTR__PlotData_00111c00;
  dVar1 = 0.0;
  for (iVar5 = 0; iVar5 != 0xb; iVar5 = iVar5 + 1) {
    local_4c = (float)(dVar1 * 0.001 + 0.0001);
    local_48 = dVar1;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>
              ((vector<float,_std::allocator<float>_> *)(pPVar2 + 1),&local_4c);
    local_4c = (float)iVar5 * -0.0001 * (float)iVar5 + 0.2;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>
              ((vector<float,_std::allocator<float>_> *)(pPVar3 + 1),&local_4c);
    dVar1 = local_48 + 1.0;
  }
  pLVar4 = (LineDataDrawer *)operator_new(0xa8);
  LineDataDrawer::LineDataDrawer(pLVar4);
  *(undefined2 *)&(pLVar4->super_DataDrawerBase).field_0x24 = 0x100;
  PlotDataContainer::AddXYPlot
            (local_38,pPVar2,pPVar3,(LegendData *)0x0,(DataDrawerBase *)pLVar4,
             (PlotDataSelection *)0x0);
  (local_40->mMargins).mLeft = 0x32;
  (local_40->mMargins).mTop = 0x14;
  return;
}

Assistant:

void MakeExamplePlot6 (PPlot &ioPPlot) {

      int theI;

      ioPPlot.mPlotBackground.mTitle = "line styles";
      PlotData *theX1 = new PlotData ();
      PlotData *theY1 = new PlotData ();
      float theFac = 100.0f/(100*100*100);
      for (theI=0;theI<=10;theI++) {
        theX1->push_back (0.0001+theI*0.001);
        theY1->push_back (0.01+theFac*theI*theI);
      }
      LineDataDrawer *theDataDrawer1 = new LineDataDrawer ();
      theDataDrawer1->mDrawPoint = true;
      theDataDrawer1->mStyle.mPenWidth = 3;
      ioPPlot.mPlotDataContainer.AddXYPlot (theX1, theY1, nullptr, theDataDrawer1);

      PlotData *theX2 = new PlotData ();
      PlotData *theY2 = new PlotData ();
      for (theI=0;theI<=10;theI++) {
        theX2->push_back (0.0001+theI*0.001);
        theY2->push_back (0.2-theFac*theI*theI);
      }
      LineDataDrawer *theDataDrawer2 = new LineDataDrawer ();
      theDataDrawer2->mDrawPoint = true;
      theDataDrawer2->mDrawLine = false;
      ioPPlot.mPlotDataContainer.AddXYPlot (theX2, theY2, nullptr, theDataDrawer2);

      ioPPlot.mMargins.mLeft = 50;
      ioPPlot.mMargins.mTop = 20;
    }